

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t __thiscall
duckdb::HexUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
          (HexUhugeIntOperator *this,uhugeint_t input,Vector *result)

{
  idx_t iVar1;
  long lVar2;
  idx_t len;
  char *pcVar3;
  uint64_t lower;
  uint64_t upper;
  ulong uVar4;
  string_t target;
  
  iVar1 = CountZeros<duckdb::uhugeint_t>::Leading((CountZeros<duckdb::uhugeint_t> *)this,input);
  uVar4 = iVar1 >> 2;
  if (uVar4 == 0x20) {
    target = StringVector::EmptyString((StringVector *)input.upper,(Vector *)0x1,len);
    pcVar3 = target.value._8_8_;
    if (target.value._0_4_ < 0xd) {
      pcVar3 = target.value.pointer.prefix;
    }
    *pcVar3 = '0';
  }
  else {
    target = StringVector::EmptyString((StringVector *)input.upper,(Vector *)(0x20 - uVar4),len);
    pcVar3 = target.value._8_8_;
    if (target.value._0_4_ < 0xd) {
      pcVar3 = target.value.pointer.prefix;
    }
    for (lVar2 = uVar4 * -4 + 0x7c; 0x43 < lVar2 + 4U; lVar2 = lVar2 + -4) {
      *pcVar3 = "0123456789ABCDEF"[(uint)(input.lower >> ((byte)lVar2 & 0x3f)) & 0xf];
      pcVar3 = pcVar3 + 1;
    }
    for (; lVar2 != -4; lVar2 = lVar2 + -4) {
      *pcVar3 = "0123456789ABCDEF"[(uint)((ulong)this >> ((byte)lVar2 & 0x3f)) & 0xf];
      pcVar3 = pcVar3 + 1;
    }
  }
  string_t::Finalize(&target);
  return (string_t)target.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		idx_t num_leading_zero = CountZeros<uhugeint_t>::Leading(UnsafeNumericCast<uhugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 2 - (num_leading_zero / 4);

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntHexBytes<uhugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}